

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_debug_getmetatable(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  GCobj *o;
  short sVar2;
  TRef TVar3;
  TRef local_7c;
  TRef local_68;
  uint local_64;
  TRef local_54;
  TRef tr;
  TRef mtref;
  GCtab *mt;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  uVar1 = *J->base;
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    _tr = *(long *)((rd->argv->u64 & 0x7fffffffffff) + 0x20);
    (J->fold).ins.field_0.ot = 0x450b;
    (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
    (J->fold).ins.field_0.op2 = 5;
    local_54 = lj_opt_fold(J);
  }
  else {
    if ((uVar1 & 0x1f000000) != 0xc000000) {
      if ((uint)((int)(rd->argv->field_4).it >> 0xf) < 0xfffffff3) {
        local_64 = 0xd;
      }
      else {
        local_64 = (int)(rd->argv->field_4).it >> 0xf ^ 0xffffffff;
      }
      o = *(GCobj **)((long)J + (ulong)(local_64 + 0x16) * 8 + -0x130);
      if (o == (GCobj *)0x0) {
        local_68 = 0x7fff;
      }
      else {
        local_68 = lj_ir_kgc(J,o,IRT_TAB);
      }
      *J->base = local_68;
      return;
    }
    _tr = *(long *)((rd->argv->u64 & 0x7fffffffffff) + 0x20);
    (J->fold).ins.field_0.ot = 0x450b;
    (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
    (J->fold).ins.field_0.op2 = 0xb;
    local_54 = lj_opt_fold(J);
  }
  sVar2 = 8;
  if (_tr != 0) {
    sVar2 = 9;
  }
  TVar3 = lj_ir_knull(J,IRT_TAB);
  (J->fold).ins.field_0.ot = sVar2 << 8 | 0x8b;
  (J->fold).ins.field_0.op1 = (IRRef1)local_54;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
  lj_opt_fold(J);
  if (_tr == 0) {
    local_7c = 0x7fff;
  }
  else {
    local_7c = local_54;
  }
  *J->base = local_7c;
  return;
}

Assistant:

static void LJ_FASTCALL recff_debug_getmetatable(jit_State *J, RecordFFData *rd)
{
  GCtab *mt;
  TRef mtref;
  TRef tr = J->base[0];
  if (tref_istab(tr)) {
    mt = tabref(tabV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_TAB_META);
  } else if (tref_isudata(tr)) {
    mt = tabref(udataV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_UDATA_META);
  } else {
    mt = tabref(basemt_obj(J2G(J), &rd->argv[0]));
    J->base[0] = mt ? lj_ir_ktab(J, mt) : TREF_NIL;
    return;
  }
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
  J->base[0] = mt ? mtref : TREF_NIL;
}